

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

string * __thiscall
helics::logLevelToString_abi_cxx11_(string *__return_storage_ptr__,helics *this,LogLevels level)

{
  pointer pcVar1;
  undefined8 uVar2;
  uint uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  uint uVar5;
  long lVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  long lVar8;
  ulong uVar9;
  uint __val;
  uint uVar10;
  uint __len;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar10 = (uint)this;
  lVar6 = 0x4fbf60;
  if (levelMaps._16_8_ != 0) {
    lVar6 = 0x4fbf60;
    lVar8 = levelMaps._16_8_;
    do {
      if ((int)uVar10 <= *(int *)(lVar8 + 0x20)) {
        lVar6 = lVar8;
      }
      lVar8 = *(long *)(lVar8 + 0x10 + (ulong)(*(int *)(lVar8 + 0x20) < (int)uVar10) * 8);
    } while (lVar8 != 0);
  }
  lVar8 = 0x4fbf60;
  if ((lVar6 != 0x4fbf60) && (lVar8 = 0x4fbf60, *(int *)(lVar6 + 0x20) <= (int)uVar10)) {
    lVar8 = lVar6;
  }
  if (lVar8 == 0x4fbf60) {
    __val = -uVar10;
    if (0 < (int)uVar10) {
      __val = uVar10;
    }
    __len = 1;
    if (9 < __val) {
      uVar9 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar5 = (uint)uVar9;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_0039c897;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_0039c897;
        }
        if (uVar5 < 10000) goto LAB_0039c897;
        uVar9 = uVar9 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar5);
      __len = __len + 1;
    }
LAB_0039c897:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_construct(&local_50,(ulong)(__len + -((int)uVar10 >> 0x1f)),'-');
    CLI::std::__detail::__to_chars_10_impl<unsigned_int>
              (local_50._M_dataplus._M_p + (uint)-((int)uVar10 >> 0x1f),__len,__val);
    pbVar4 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_50,0,0,"loglevel_",9);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pbVar4->_M_dataplus)._M_p;
    paVar7 = &pbVar4->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar7) {
      uVar2 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    lVar6 = *(long *)(lVar8 + 0x30);
    lVar8 = *(long *)(lVar8 + 0x28);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,lVar6,lVar8 + lVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string logLevelToString(LogLevels level)
{
    auto res = levelMaps.find(level);
    if (res != levelMaps.end()) {
        return std::string(res->second);
    }
    std::string ret = "loglevel_" + std::to_string(static_cast<int>(level));
    return ret;
}